

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

void Abc_CollectTopOr_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  Abc_Obj_t *pObj_00;
  
  for (; (((ulong)pObj & 1) == 0 && ((*(uint *)&pObj->field_0x14 & 0xf) == 7));
      pObj = (Abc_Obj_t *)
             ((ulong)(*(uint *)&pObj->field_0x14 >> 0xb & 1) ^
             (ulong)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]])) {
    pObj_00 = Abc_ObjChild0(pObj);
    Abc_CollectTopOr_rec(pObj_00,vSuper);
  }
  Vec_PtrPush(vSuper,pObj);
  return;
}

Assistant:

void Abc_CollectTopOr_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( Abc_ObjIsComplement(pObj) || !Abc_ObjIsNode(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return;
    }
    // go through the branches
    Abc_CollectTopOr_rec( Abc_ObjChild0(pObj), vSuper );
    Abc_CollectTopOr_rec( Abc_ObjChild1(pObj), vSuper );
}